

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O2

basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> * __thiscall
type_safe::basic_variant<type_safe::optional_variant_policy,int,double,debugger_type>::
map<C_A_T_C_H_T_E_S_T_0()::functor_t&,int,void,void>
          (basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>
           *__return_storage_ptr__,
          basic_variant<type_safe::optional_variant_policy,int,double,debugger_type> *this,
          functor_t *f,int *args)

{
  long lVar1;
  variant_storage<type_safe::optional_variant_policy,_int,_double,_debugger_type> *pvVar2;
  unsigned_long uStack_30;
  
  (__return_storage_ptr__->storage_).storage_.cur_type_.
  super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>.
  value_ = 0;
  lVar1 = *(long *)(this + 0x10);
  if (lVar1 == 3) {
    tagged_union<int,_double,_debugger_type>::check<debugger_type>
              ((tagged_union<int,_double,_debugger_type> *)this);
    ::C_A_T_C_H_T_E_S_T_0::functor_t::operator()(f,(debugger_type *)this,*args);
    pvVar2 = &__return_storage_ptr__->storage_;
    (pvVar2->storage_).storage_.storage_[0] = '*';
    (pvVar2->storage_).storage_.storage_[1] = '\0';
    (pvVar2->storage_).storage_.storage_[2] = '\0';
    (pvVar2->storage_).storage_.storage_[3] = '\0';
  }
  else {
    if (lVar1 == 2) {
      tagged_union<int,_double,_debugger_type>::check<double>
                ((tagged_union<int,_double,_debugger_type> *)this);
      *(undefined8 *)(__return_storage_ptr__->storage_).storage_.storage_.storage_ =
           *(undefined8 *)this;
      uStack_30 = 2;
      goto LAB_001b3524;
    }
    if (lVar1 != 1) {
      return __return_storage_ptr__;
    }
    tagged_union<int,_double,_debugger_type>::check<int>
              ((tagged_union<int,_double,_debugger_type> *)this);
    ::C_A_T_C_H_T_E_S_T_0::functor_t::operator()(f,*(int *)this,*args);
    pvVar2 = &__return_storage_ptr__->storage_;
    (pvVar2->storage_).storage_.storage_[0] = '\f';
    (pvVar2->storage_).storage_.storage_[1] = '\0';
    (pvVar2->storage_).storage_.storage_[2] = '\0';
    (pvVar2->storage_).storage_.storage_[3] = '\0';
  }
  uStack_30 = 1;
LAB_001b3524:
  (__return_storage_ptr__->storage_).storage_.cur_type_.
  super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>.
  value_ = uStack_30;
  return __return_storage_ptr__;
}

Assistant:

basic_variant map(Functor&& f, Args&&... args) const TYPE_SAFE_LVALUE_REF
    {
        basic_variant result(force_empty{});
        if (!has_value())
            return result;
        detail::map_union<Functor&&, union_t>::map(result.storage_.get_union(),
                                                   storage_.get_union(), std::forward<Functor>(f),
                                                   std::forward<Args>(args)...);
        DEBUG_ASSERT(result.has_value(), detail::assert_handler{});
        return result;
    }